

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateSSEImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPU4StateSSEImpl<double,2,0>::accumulateDerivativesImpl<false,false,false>
          (BeagleCPU4StateSSEImpl<double,_2,_0> *this,double *outDerivatives,
          double *outSumDerivatives,double *outSumSquaredDerivatives)

{
  long in_RDI;
  V_Real vSum;
  undefined4 local_ac;
  double derivative_1;
  double sumSquared;
  double sum;
  V_Real patternWeight;
  V_Real derivative;
  V_Real denominator;
  V_Real numerator;
  int k;
  V_Real vSumSquared;
  
  for (local_ac = 0; local_ac < *(int *)(in_RDI + 0x14) + -1; local_ac = local_ac + 2) {
    vdivpd_avx(*(undefined1 (*) [16])(*(long *)(in_RDI + 0x100) + (long)local_ac * 8),
               *(undefined1 (*) [16])(*(long *)(in_RDI + 0xf8) + (long)local_ac * 8));
  }
  for (; local_ac < *(int *)(in_RDI + 0x14); local_ac = local_ac + 1) {
  }
  return;
}

Assistant:

void BeagleCPU4StateSSEImpl<BEAGLE_CPU_4_SSE_DOUBLE>::accumulateDerivativesImpl(
        double* outDerivatives,
        double* outSumDerivatives,
        double* outSumSquaredDerivatives) {

    V_Real vSum = VEC_SETZERO();
    V_Real vSumSquared = VEC_SETZERO();

    int k = 0;
    for (; k < kPatternCount - 1; k += 2) {

        V_Real numerator = VEC_LOAD(grandNumeratorDerivTmp + k);
        V_Real denominator = VEC_LOAD(grandDenominatorDerivTmp + k);
        V_Real derivative = VEC_DIV(numerator, denominator);
        V_Real patternWeight = VEC_LOAD(gPatternWeights + k);

        if (DoDerivatives) {
            VEC_STOREU(outDerivatives + k, derivative);
        }

        if (DoSum) {
            vSum = VEC_MADD(derivative, patternWeight, vSum);
        }

        if (DoSumSquared) {
            derivative = VEC_MULT(derivative, derivative);
            vSumSquared = VEC_MADD(derivative, patternWeight, vSumSquared);
        }
    }

    double sum;
    double sumSquared;

    if (DoSum) {
        sum = _mm_cvtsd_f64(VEC_ADD(vSum, VEC_SWAP(vSum)));
    }

    if (DoSumSquared) {
        sumSquared = _mm_cvtsd_f64(VEC_ADD(vSumSquared, VEC_SWAP(vSumSquared)));
    }

    for (; k < kPatternCount; ++k) {
        double derivative = grandNumeratorDerivTmp[k] / grandDenominatorDerivTmp[k];
        if (DoDerivatives) {
            outDerivatives[k] = derivative;
        }
        if (DoSum) {
            sum += derivative * gPatternWeights[k];
        }
        if (DoSumSquared) {
            sumSquared += derivative * derivative * gPatternWeights[k];
        }
    }

    if (DoSum) {
        *outSumDerivatives = sum;
    }

    if (DoSumSquared) {
        *outSumSquaredDerivatives = sumSquared;
    }
}